

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O2

void ga_pose_log(ga_pose *x)

{
  uint __line;
  undefined8 in_RAX;
  char *__assertion;
  
  if (x == (ga_pose *)0x0) {
    __assertion = "x";
    __line = 0x50;
  }
  else if (x->target_frame == (frame *)0x0) {
    __assertion = "x->target_frame";
    __line = 0x51;
  }
  else if (x->target_body == (body *)0x0) {
    __assertion = "x->target_body";
    __line = 0x52;
  }
  else if (x->reference_frame == (frame *)0x0) {
    __assertion = "x->reference_frame";
    __line = 0x53;
  }
  else {
    if (x->reference_body != (body *)0x0) {
      printf("PoseADT(target={%s}|%s, reference={%s}|%s)\n",x->target_frame->name,
             x->target_body->name,x->reference_frame->name,x->reference_body->name,in_RAX);
      return;
    }
    __assertion = "x->reference_body";
    __line = 0x54;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,__line,"void ga_pose_log(const struct ga_pose *)");
}

Assistant:

void ga_pose_log(
        const struct ga_pose *x)
{
    assert(x);
    assert(x->target_frame);
    assert(x->target_body);
    assert(x->reference_frame);
    assert(x->reference_body);

    printf("PoseADT(target={%s}|%s, reference={%s}|%s)\n",
            x->target_frame->name,
            x->target_body->name,
            x->reference_frame->name,
            x->reference_body->name);
}